

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O0

void crc_init(void)

{
  uint uVar1;
  uint *puStack_20;
  uint poly;
  uint *q;
  uint *p;
  uint t;
  int i;
  
  q = crc_table;
  crc_table[0] = 0;
  puStack_20 = crc_table;
  crc_table[1] = 0x864cfb;
  for (p._4_4_ = 1; puStack_20 = puStack_20 + 2, p._4_4_ < 0x80; p._4_4_ = p._4_4_ + 1) {
    uVar1 = q[1];
    if ((uVar1 & 0x800000) == 0) {
      *puStack_20 = uVar1 << 1;
      puStack_20[1] = uVar1 << 1 ^ 0x864cfb;
    }
    else {
      *puStack_20 = uVar1 << 1 ^ 0x864cfb;
      puStack_20[1] = uVar1 << 1;
    }
    q = q + 1;
  }
  return;
}

Assistant:

void
crc_init(void)
{
	int i;
	unsigned int t, *p, *q;
	unsigned int poly = 0x864CFB;

	p = q = crc_table;
	*q++ = 0;
	*q++ = poly;

	for (i = 1; i < 128; i++) {
		t = *(++p);
		if (t & 0x800000) {
			t <<= 1;
			*q++ = t ^ poly;
			*q++ = t;
		}
		else {
			t <<= 1;
			*q++ = t;
			*q++ = t ^ poly;
		}
	}
}